

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O1

void __thiscall
QNetworkRequestFactory::clearAttribute(QNetworkRequestFactory *this,Attribute attribute)

{
  Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *this_00;
  QNetworkRequestFactoryPrivate *pQVar1;
  Node<QNetworkRequest::Attribute,_QVariant> *pNVar2;
  long in_FS_OFFSET;
  Attribute local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (((this->d).d.ptr)->attributes).d;
  local_14 = attribute;
  if (this_00 != (Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_>::
             findNode<QNetworkRequest::Attribute>(this_00,&local_14);
    if (pNVar2 != (Node<QNetworkRequest::Attribute,_QVariant> *)0x0) {
      pQVar1 = (this->d).d.ptr;
      if ((pQVar1 != (QNetworkRequestFactoryPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach_helper(&this->d);
      }
      QHash<QNetworkRequest::Attribute,_QVariant>::removeImpl<QNetworkRequest::Attribute>
                (&((this->d).d.ptr)->attributes,&local_14);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkRequestFactory::clearAttribute(QNetworkRequest::Attribute attribute)
{
    if (!d->attributes.contains(attribute))
        return;
    d.detach();
    d->attributes.remove(attribute);
}